

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O1

void __thiscall
re2c::DFA::emit(DFA *this,Output *output,uint32_t *ind,bool isLastCond,bool *bPrologBrace)

{
  counter_t<re2c::label_t> *this_00;
  pointer pbVar1;
  pointer pbVar2;
  long lVar3;
  pointer pcVar4;
  int iVar5;
  BitMap *pBVar6;
  key_type start;
  bool bVar7;
  opt_t *poVar8;
  OutputFile *pOVar9;
  Output *this_01;
  const_iterator cVar10;
  uint32_t uVar11;
  undefined7 in_register_00000009;
  State *pSVar12;
  long lVar13;
  uint64_t n;
  long lVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  byte bVar16;
  string *psVar17;
  uint cMax;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar18;
  label_t start_label;
  uint32_t i;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> used_labels;
  label_t local_c0;
  key_type local_bc;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  bool *local_90;
  undefined4 local_84;
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
  local_60;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,isLastCond);
  local_90 = bPrologBrace;
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  bVar16 = bWroteCondCheck & poVar8->cFlag;
  this_00 = &(output->source).label_counter;
  uVar11 = (output->source).label_counter.num.value;
  label_t::inc(&this_00->num);
  local_bc.value = uVar11;
  if ((bVar16 == 0) &&
     (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->cFlag == true)) {
    local_c0.value = (this_00->num).value;
    label_t::inc(&this_00->num);
  }
  else {
    local_c0.value = local_bc.value;
  }
  for (pSVar12 = this->head; start.value = local_bc.value, pSVar12 != (State *)0x0;
      pSVar12 = pSVar12->next) {
    uVar11 = (this_00->num).value;
    label_t::inc(&this_00->num);
    (pSVar12->label).value = uVar11;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar7 = OutputFile::get_force_start_label(&output->source);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar7;
  count_used_labels(this,(set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                          *)&local_60,(label_t)start.value,local_c0,bVar7);
  Action::set_initial(&this->head->action,local_c0,(this->head->action).type == SAVE);
  Skeleton::warn_undefined_control_flow(this->skeleton);
  Skeleton::warn_unreachable_rules(this->skeleton);
  Skeleton::warn_match_empty(this->skeleton);
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (poVar8->target == SKELETON) {
    pVar18 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&output->skeletons,&this->name);
    if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Skeleton::emit_data(this->skeleton,(output->source).file_name);
      Skeleton::emit_start
                (this->skeleton,&output->source,this->max_fill,this->need_backup,
                 this->need_backupctx,this->need_accept);
      local_b8._M_dataplus._M_p._0_4_ = 2;
      emit_body(this,&output->source,(uint32_t *)&local_b8,
                (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
                &local_60,local_c0);
      Skeleton::emit_end(this->skeleton,&output->source,this->need_backup,this->need_backupctx);
    }
    goto LAB_0011d5af;
  }
  if (bVar16 == 0) {
    pOVar9 = OutputFile::ws(&output->source,"\n");
    OutputFile::wdelay_line_info(pOVar9);
    poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar8->target == DOT) {
      *local_90 = true;
      pcVar15 = "digraph re2c {\n";
      this_01 = output;
LAB_0011cbc8:
      OutputFile::ws(&this_01->source,pcVar15);
    }
    else {
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      if ((((((poVar8->fFlag == false) &&
             (bVar7 = OutputFile::get_used_yyaccept(&output->source), bVar7)) ||
            ((poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->fFlag == false &&
             (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->bEmitYYCh != false
             )))) || (((poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868),
                       poVar8->bFlag == true &&
                       (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868),
                       poVar8->cFlag == false)) && (BitMap::first != (BitMap *)0x0)))) ||
          (((poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->cFlag == true &&
            (bWroteCondCheck == 0)) &&
           (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->gFlag != false))))
         || (((poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->fFlag == true &&
              (bWroteGetState == '\0')) &&
             (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->gFlag == true))))
      {
        *local_90 = true;
        uVar11 = *ind;
        *ind = uVar11 + 1;
        this_01 = (Output *)OutputFile::wind(&output->source,uVar11);
        pcVar15 = "{\n";
        goto LAB_0011cbc8;
      }
      if (*ind == 0) {
        *ind = 1;
      }
    }
    poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((poVar8->fFlag == false) &&
       (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->target != DOT)) {
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      if (poVar8->bEmitYYCh == true) {
        pOVar9 = OutputFile::wind(&output->source,*ind);
        poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        pOVar9 = OutputFile::wstring(pOVar9,&poVar8->yyctype);
        pOVar9 = OutputFile::ws(pOVar9," ");
        poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        pOVar9 = OutputFile::wstring(pOVar9,&poVar8->yych);
        OutputFile::ws(pOVar9,";\n");
      }
      OutputFile::wdelay_yyaccept_init(&output->source,*ind);
    }
    else {
      OutputFile::ws(&output->source,"\n");
    }
  }
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (((poVar8->bFlag == true) &&
      (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->cFlag == false)) &&
     (BitMap::first != (BitMap *)0x0)) {
    uVar11 = 0x100;
    if (this->ubChar < 0x100) {
      uVar11 = this->ubChar;
    }
    BitMap::gen(&output->source,*ind,this->lbChar,uVar11);
  }
  if (bVar16 == 0) {
    poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (((poVar8->cFlag == true) && (bWroteCondCheck == 0)) &&
       (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->gFlag == true)) {
      local_98 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ulong)*ind;
      pbVar1 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pOVar9 = OutputFile::wind(&output->source,*ind);
      pOVar9 = OutputFile::ws(pOVar9,"static void *");
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar8->yyctable);
      pOVar9 = OutputFile::ws(pOVar9,"[");
      n = (long)pbVar2 - (long)pbVar1 >> 5;
      pOVar9 = OutputFile::wu64(pOVar9,n);
      OutputFile::ws(pOVar9,"] = {\n");
      if (pbVar2 != pbVar1) {
        iVar5 = (int)local_98;
        lVar14 = n + (n == 0);
        lVar13 = 0;
        do {
          pOVar9 = OutputFile::wind(&output->source,iVar5 + 1);
          pOVar9 = OutputFile::ws(pOVar9,"&&");
          poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          pOVar9 = OutputFile::wstring(pOVar9,&poVar8->condPrefix);
          pOVar9 = OutputFile::wstring(pOVar9,(string *)
                                              ((long)&(((output->types).
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar13));
          OutputFile::ws(pOVar9,",\n");
          lVar13 = lVar13 + 0x20;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      pOVar9 = OutputFile::wind(&output->source,(uint32_t)local_98);
      OutputFile::ws(pOVar9,"};\n");
    }
    OutputFile::wdelay_state_goto(&output->source,*ind);
    poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (((poVar8->cFlag == true) &&
        (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->target != DOT)) &&
       (cVar10 = std::
                 _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                 ::find(&local_60,&local_bc),
       (_Rb_tree_header *)cVar10._M_node != &local_60._M_impl.super__Rb_tree_header)) {
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pOVar9 = OutputFile::wstring(&output->source,&poVar8->labelPrefix);
      pOVar9 = OutputFile::wlabel(pOVar9,(label_t)local_bc.value);
      OutputFile::ws(pOVar9,":\n");
    }
    OutputFile::wuser_start_label(&output->source);
    poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if ((poVar8->cFlag == true) && (bWroteCondCheck == 0)) {
      uVar11 = *ind;
      pbVar1 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (output->types).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      local_98 = &output->types;
      lVar13 = (long)pbVar2 - (long)pbVar1 >> 5;
      if (poVar8->target == DOT) {
        (output->source).warn_condition_order = false;
        if (pbVar2 != pbVar1) {
          lVar13 = lVar13 + (ulong)(lVar13 == 0);
          lVar14 = 8;
          do {
            pbVar1 = (local_98->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar3 = *(long *)((long)pbVar1 + lVar14 + -8);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,lVar3,
                       *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar14) + lVar3);
            pOVar9 = OutputFile::ws(&output->source,"0 -> ");
            pOVar9 = OutputFile::wstring(pOVar9,&local_b8);
            pOVar9 = OutputFile::ws(pOVar9," [label=\"state=");
            pOVar9 = OutputFile::wstring(pOVar9,&local_b8);
            OutputFile::ws(pOVar9,"\"]\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            lVar14 = lVar14 + 0x20;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
      }
      else {
        poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        if (poVar8->gFlag == true) {
          pOVar9 = OutputFile::wind(&output->source,uVar11);
          pOVar9 = OutputFile::ws(pOVar9,"goto *");
          poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          pOVar9 = OutputFile::wstring(pOVar9,&poVar8->yyctable);
          pOVar9 = OutputFile::ws(pOVar9,"[");
          genGetCondition_abi_cxx11_();
          pOVar9 = OutputFile::wstring(pOVar9,&local_b8);
          OutputFile::ws(pOVar9,"];\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          if (poVar8->sFlag == true) {
            if ((long)pbVar2 - (long)pbVar1 == 0x20) {
              (output->source).warn_condition_order = false;
            }
            cMax = (int)lVar13 - 1;
            value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)cMax
            ;
            genCondGotoSub(&output->source,uVar11,local_98,0,cMax);
          }
          else {
            (output->source).warn_condition_order = false;
            pOVar9 = OutputFile::wind(&output->source,uVar11);
            pOVar9 = OutputFile::ws(pOVar9,"switch (");
            genGetCondition_abi_cxx11_();
            pOVar9 = OutputFile::wstring(pOVar9,&local_b8);
            OutputFile::ws(pOVar9,") {\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (pbVar2 != pbVar1) {
              lVar13 = lVar13 + (ulong)(lVar13 == 0);
              lVar14 = 0;
              do {
                psVar17 = (string *)
                          ((long)&(((output->types).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar14);
                pOVar9 = OutputFile::wind(&output->source,uVar11);
                pOVar9 = OutputFile::ws(pOVar9,"case ");
                poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
                pOVar9 = OutputFile::wstring(pOVar9,&poVar8->condEnumPrefix);
                pOVar9 = OutputFile::wstring(pOVar9,psVar17);
                pOVar9 = OutputFile::ws(pOVar9,": goto ");
                poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
                pOVar9 = OutputFile::wstring(pOVar9,&poVar8->condPrefix);
                pOVar9 = OutputFile::wstring(pOVar9,psVar17);
                OutputFile::ws(pOVar9,";\n");
                lVar14 = lVar14 + 0x20;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
            }
            pOVar9 = OutputFile::wind(&output->source,uVar11);
            OutputFile::ws(pOVar9,"}\n");
          }
        }
      }
      OutputFile::wdelay_warn_condition_order(&output->source);
      bWroteCondCheck = 1;
    }
  }
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if ((poVar8->cFlag == true) && ((this->cond)._M_string_length != 0)) {
    poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    psVar17 = &this->cond;
    if ((poVar8->condDivider)._M_string_length != 0) {
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pcVar4 = (poVar8->condDivider)._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar4,pcVar4 + (poVar8->condDivider)._M_string_length);
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      replaceParam<std::__cxx11::string>
                (&local_b8,(re2c *)local_80,&poVar8->condDividerParam,psVar17,value);
      pOVar9 = OutputFile::wstring(&output->source,&local_b8);
      OutputFile::ws(pOVar9,"\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
    }
    poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    if (poVar8->target == DOT) {
      pOVar9 = OutputFile::wstring(&output->source,psVar17);
      pOVar9 = OutputFile::ws(pOVar9," -> ");
      pOVar9 = OutputFile::wlabel(pOVar9,(label_t)(this->head->label).value);
      pcVar15 = "\n";
    }
    else {
      poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      pOVar9 = OutputFile::wstring(&output->source,&poVar8->condPrefix);
      pOVar9 = OutputFile::wstring(pOVar9,psVar17);
      pcVar15 = ":\n";
    }
    OutputFile::ws(pOVar9,pcVar15);
  }
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (((poVar8->cFlag == true) &&
      (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->bFlag == true)) &&
     (BitMap::first != (BitMap *)0x0)) {
    uVar11 = *ind;
    *ind = uVar11 + 1;
    pOVar9 = OutputFile::wind(&output->source,uVar11);
    OutputFile::ws(pOVar9,"{\n");
    uVar11 = 0x100;
    if (this->ubChar < 0x100) {
      uVar11 = this->ubChar;
    }
    BitMap::gen(&output->source,*ind,this->lbChar,uVar11);
  }
  emit_body(this,&output->source,ind,
            (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
            &local_60,local_c0);
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (((poVar8->cFlag == true) &&
      (poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar8->bFlag == true)) &&
     (BitMap::first != (BitMap *)0x0)) {
    uVar11 = *ind;
    *ind = uVar11 - 1;
    pOVar9 = OutputFile::wind(&output->source,uVar11 - 1);
    OutputFile::ws(pOVar9,"}\n");
  }
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (((byte)(poVar8->cFlag ^ 1U | (byte)local_84) == 1) && (*local_90 == true)) {
    uVar11 = *ind;
    *ind = uVar11 - 1;
    pOVar9 = OutputFile::wind(&output->source,uVar11 - 1);
    OutputFile::ws(pOVar9,"}\n");
  }
LAB_0011d5af:
  pBVar6 = BitMap::first;
  if (BitMap::first != (BitMap *)0x0) {
    BitMap::~BitMap(BitMap::first);
    operator_delete(pBVar6,0x20);
    BitMap::first = (BitMap *)0x0;
  }
  std::
  _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DFA::emit(Output & output, uint32_t& ind, bool isLastCond, bool& bPrologBrace)
{
	OutputFile & o = output.source;

	bool bProlog = (!opts->cFlag || !bWroteCondCheck);

	// start_label points to the beginning of current re2c block
	// (prior to condition dispatch in '-c' mode)
	// it can forced by configuration 're2c:startlabel = <integer>;'
	label_t start_label = o.label_counter.next ();
	// initial_label points to the beginning of DFA
	// in '-c' mode this is NOT equal to start_label
	label_t initial_label = bProlog && opts->cFlag
		? o.label_counter.next ()
		: start_label;
	for (State * s = head; s; s = s->next)
	{
		s->label = o.label_counter.next ();
	}
	std::set<label_t> used_labels;
	count_used_labels (used_labels, start_label, initial_label, o.get_force_start_label ());

	head->action.set_initial (initial_label, head->action.type == Action::SAVE);

	skeleton->warn_undefined_control_flow ();
	skeleton->warn_unreachable_rules ();
	skeleton->warn_match_empty ();

	if (opts->target == opt_t::SKELETON)
	{
		if (output.skeletons.insert (name).second)
		{
			skeleton->emit_data (o.file_name);
			skeleton->emit_start (o, max_fill, need_backup, need_backupctx, need_accept);
			uint32_t i = 2;
			emit_body (o, i, used_labels, initial_label);
			skeleton->emit_end (o, need_backup, need_backupctx);
		}
	}
	else
	{
		// Generate prolog
		if (bProlog)
		{
			o.ws("\n").wdelay_line_info ();
			if (opts->target == opt_t::DOT)
			{
				bPrologBrace = true;
				o.ws("digraph re2c {\n");
			}
			else if ((!opts->fFlag && o.get_used_yyaccept ())
			||  (!opts->fFlag && opts->bEmitYYCh)
			||  (opts->bFlag && !opts->cFlag && BitMap::first)
			||  (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			||  (opts->fFlag && !bWroteGetState && opts->gFlag)
			)
			{
				bPrologBrace = true;
				o.wind(ind++).ws("{\n");
			}
			else if (ind == 0)
			{
				ind = 1;
			}
			if (!opts->fFlag && opts->target != opt_t::DOT)
			{
				if (opts->bEmitYYCh)
				{
					o.wind(ind).wstring(opts->yyctype).ws(" ").wstring(opts->yych).ws(";\n");
				}
				o.wdelay_yyaccept_init (ind);
			}
			else
			{
				o.ws("\n");
			}
		}
		if (opts->bFlag && !opts->cFlag && BitMap::first)
		{
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		if (bProlog)
		{
			if (opts->cFlag && !bWroteCondCheck && opts->gFlag)
			{
				genCondTable(o, ind, output.types);
			}
			o.wdelay_state_goto (ind);
			if (opts->cFlag && opts->target != opt_t::DOT)
			{
				if (used_labels.count(start_label))
				{
					o.wstring(opts->labelPrefix).wlabel(start_label).ws(":\n");
				}
			}
			o.wuser_start_label ();
			if (opts->cFlag && !bWroteCondCheck)
			{
				genCondGoto(o, ind, output.types);
			}
		}
		if (opts->cFlag && !cond.empty())
		{
			if (opts->condDivider.length())
			{
				o.wstring(replaceParam(opts->condDivider, opts->condDividerParam, cond)).ws("\n");
			}
			if (opts->target == opt_t::DOT)
			{
				o.wstring(cond).ws(" -> ").wlabel(head->label).ws("\n");
			}
			else
			{
				o.wstring(opts->condPrefix).wstring(cond).ws(":\n");
			}
		}
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(ind++).ws("{\n");
			BitMap::gen(o, ind, lbChar, ubChar <= 256 ? ubChar : 256);
		}
		// Generate code
		emit_body (o, ind, used_labels, initial_label);
		if (opts->cFlag && opts->bFlag && BitMap::first)
		{
			o.wind(--ind).ws("}\n");
		}
		// Generate epilog
		if ((!opts->cFlag || isLastCond) && bPrologBrace)
		{
			o.wind(--ind).ws("}\n");
		}
	}

	// Cleanup
	if (BitMap::first)
	{
		delete BitMap::first;
		BitMap::first = NULL;
	}
}